

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglCreateContextTests.cpp
# Opt level: O2

void __thiscall
deqp::egl::CreateContextCase::executeForConfig
          (CreateContextCase *this,EGLDisplay display,EGLConfig config)

{
  ostringstream *poVar1;
  TestLog *pTVar2;
  EGLint EVar3;
  uint uVar4;
  deUint32 dVar5;
  int value;
  Library *egl;
  MessageBuilder *this_00;
  Hex<16UL> hex;
  char *pcVar6;
  long lVar7;
  MessageBuilder local_1b0;
  undefined4 extraout_var;
  
  egl = EglTestContext::getLibrary((this->super_SimpleConfigCase).super_TestCase.m_eglTestCtx);
  pTVar2 = ((this->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
           m_log;
  EVar3 = eglu::getConfigAttribInt(egl,display,config,0x3028);
  uVar4 = eglu::getConfigAttribInt(egl,display,config,0x3040);
  for (lVar7 = 0; lVar7 != 0x78; lVar7 = lVar7 + 0x18) {
    if ((*(uint *)(s_apis + lVar7 + 0xc) & uVar4) != 0) {
      poVar1 = &local_1b0.m_str;
      local_1b0.m_log = pTVar2;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
      std::operator<<((ostream *)poVar1,"Creating ");
      this_00 = tcu::MessageBuilder::operator<<(&local_1b0,(char **)(s_apis + lVar7));
      std::operator<<((ostream *)&this_00->m_str," context with config ID ");
      std::ostream::operator<<(&this_00->m_str,EVar3);
      tcu::MessageBuilder::operator<<(this_00,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
      dVar5 = (*egl->_vptr_Library[0x1f])(egl);
      eglu::checkError(dVar5,"init",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglCreateContextTests.cpp"
                       ,0x5d);
      (**egl->_vptr_Library)(egl,(ulong)*(uint *)(s_apis + lVar7 + 8));
      dVar5 = (*egl->_vptr_Library[0x1f])(egl);
      eglu::checkError(dVar5,"bindAPI(s_apis[apiNdx].api)",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglCreateContextTests.cpp"
                       ,0x5f);
      hex.value._0_4_ =
           (*egl->_vptr_Library[6])(egl,display,config,0,*(undefined8 *)(s_apis + lVar7 + 0x10));
      hex.value._4_4_ = extraout_var;
      value = (*egl->_vptr_Library[0x1f])(egl);
      if (hex.value == 0 || value != 0x3000) {
        poVar1 = &local_1b0.m_str;
        local_1b0.m_log = pTVar2;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
        std::operator<<((ostream *)poVar1,"  Fail, context: ");
        tcu::Format::operator<<((ostream *)poVar1,hex);
        std::operator<<((ostream *)poVar1,", error: ");
        pcVar6 = eglu::getErrorName(value);
        std::operator<<((ostream *)poVar1,pcVar6);
        tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
        tcu::TestContext::setTestResult
                  ((this->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode.
                   m_testCtx,QP_TEST_RESULT_FAIL,"Failed to create context");
      }
      else {
        (*egl->_vptr_Library[0x13])(egl,display,hex.value);
        dVar5 = (*egl->_vptr_Library[0x1f])(egl);
        eglu::checkError(dVar5,"destroyContext(display, context)",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglCreateContextTests.cpp"
                         ,0x6c);
        local_1b0.m_log = pTVar2;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0.m_str);
        std::operator<<((ostream *)&local_1b0.m_str,"  Pass");
        tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1b0.m_str);
      }
    }
  }
  return;
}

Assistant:

void CreateContextCase::executeForConfig (EGLDisplay display, EGLConfig config)
{
	const Library&	egl		= m_eglTestCtx.getLibrary();
	TestLog&		log		= m_testCtx.getLog();
	EGLint			id		= eglu::getConfigAttribInt(egl, display, config, EGL_CONFIG_ID);
	EGLint			apiBits	= eglu::getConfigAttribInt(egl, display, config, EGL_RENDERABLE_TYPE);

	for (int apiNdx = 0; apiNdx < (int)DE_LENGTH_OF_ARRAY(s_apis); apiNdx++)
	{
		if ((apiBits & s_apis[apiNdx].apiBit) == 0)
			continue; // Not supported API

		log << TestLog::Message << "Creating " << s_apis[apiNdx].name << " context with config ID " << id << TestLog::EndMessage;
		EGLU_CHECK_MSG(egl, "init");

		EGLU_CHECK_CALL(egl, bindAPI(s_apis[apiNdx].api));

		EGLContext	context = egl.createContext(display, config, EGL_NO_CONTEXT, s_apis[apiNdx].ctxAttrs);
		EGLenum		err		= egl.getError();

		if (context == EGL_NO_CONTEXT || err != EGL_SUCCESS)
		{
			log << TestLog::Message << "  Fail, context: " << tcu::toHex(context) << ", error: " << eglu::getErrorName(err) << TestLog::EndMessage;
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Failed to create context");
		}
		else
		{
			// Destroy
			EGLU_CHECK_CALL(egl, destroyContext(display, context));
			log << TestLog::Message << "  Pass" << TestLog::EndMessage;
		}
	}
}